

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3RollbackAll(sqlite3 *db,int tripCode)

{
  Btree *p;
  bool bVar1;
  int iVar2;
  Vdbe *pVVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  if (sqlite3Hooks_0 != (code *)0x0) {
    (*sqlite3Hooks_0)();
  }
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  if ((db->mDbFlags & 1) == 0) {
    bVar6 = false;
  }
  else {
    bVar6 = (db->init).busy == '\0';
  }
  iVar2 = db->nDb;
  if (iVar2 < 1) {
    bVar1 = true;
  }
  else {
    lVar4 = 0;
    lVar5 = 8;
    bVar1 = false;
    do {
      p = *(Btree **)((long)&db->aDb->zDbSName + lVar5);
      if (p != (Btree *)0x0) {
        if (p->inTrans == '\x02') {
          bVar1 = true;
        }
        sqlite3BtreeRollback(p,tripCode,(uint)(bVar6 ^ 1));
        iVar2 = db->nDb;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x20;
    } while (lVar4 < iVar2);
    bVar1 = !bVar1;
  }
  callFinaliser(db,0x88);
  if (sqlite3Hooks_1 != (code *)0x0) {
    (*sqlite3Hooks_1)();
  }
  if (bVar6 != false) {
    for (pVVar3 = db->pVdbe; pVVar3 != (Vdbe *)0x0; pVVar3 = pVVar3->pVNext) {
      *(ushort *)&pVVar3->field_0xc8 = ((ushort)*(undefined4 *)&pVVar3->field_0xc8 & 0xfffc) + 1;
    }
    sqlite3ResetAllSchemasOfConnection(db);
  }
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  db->nDeferredCons = 0;
  db->nDeferredImmCons = 0;
  db->flags = db->flags & 0xfffffffdfff7ffff;
  if ((db->xRollbackCallback != (_func_void_void_ptr *)0x0) &&
     ((!bVar1 || (db->autoCommit == '\0')))) {
    (*db->xRollbackCallback)(db->pRollbackArg);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RollbackAll(sqlite3 *db, int tripCode){
  int i;
  int inTrans = 0;
  int schemaChange;
  assert( sqlite3_mutex_held(db->mutex) );
  sqlite3BeginBenignMalloc();

  /* Obtain all b-tree mutexes before making any calls to BtreeRollback().
  ** This is important in case the transaction being rolled back has
  ** modified the database schema. If the b-tree mutexes are not taken
  ** here, then another shared-cache connection might sneak in between
  ** the database rollback and schema reset, which can cause false
  ** corruption reports in some cases.  */
  sqlite3BtreeEnterAll(db);
  schemaChange = (db->mDbFlags & DBFLAG_SchemaChange)!=0 && db->init.busy==0;

  for(i=0; i<db->nDb; i++){
    Btree *p = db->aDb[i].pBt;
    if( p ){
      if( sqlite3BtreeTxnState(p)==SQLITE_TXN_WRITE ){
        inTrans = 1;
      }
      sqlite3BtreeRollback(p, tripCode, !schemaChange);
    }
  }
  sqlite3VtabRollback(db);
  sqlite3EndBenignMalloc();

  if( schemaChange ){
    sqlite3ExpirePreparedStatements(db, 0);
    sqlite3ResetAllSchemasOfConnection(db);
  }
  sqlite3BtreeLeaveAll(db);

  /* Any deferred constraint violations have now been resolved. */
  db->nDeferredCons = 0;
  db->nDeferredImmCons = 0;
  db->flags &= ~(u64)(SQLITE_DeferFKs|SQLITE_CorruptRdOnly);

  /* If one has been configured, invoke the rollback-hook callback */
  if( db->xRollbackCallback && (inTrans || !db->autoCommit) ){
    db->xRollbackCallback(db->pRollbackArg);
  }
}